

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<float> * __thiscall
qclab::dense::SquareMatrix<float>::operator*=(SquareMatrix<float> *this,SquareMatrix<float> *rhs)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> __p;
  tuple<float_*,_std::default_delete<float[]>_> in_RAX;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t i;
  long lVar9;
  float *pfVar10;
  pointer pfVar11;
  unique_ptr<float[],_std::default_delete<float[]>_> new_data;
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> local_38;
  
  lVar1 = this->size_;
  if (lVar1 == rhs->size_) {
    local_38._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (tuple<float_*,_std::default_delete<float[]>_>)
         (tuple<float_*,_std::default_delete<float[]>_>)
         in_RAX.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl;
    init_unique_array<float>((dense *)&local_38,lVar1 * lVar1);
    __p._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         local_38._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl;
    lVar1 = this->size_;
    lVar4 = 0;
    lVar5 = 0;
    if (0 < lVar1) {
      lVar5 = lVar1;
    }
    for (lVar7 = 0; lVar7 != lVar5; lVar7 = lVar7 + 1) {
      lVar8 = 0;
      for (lVar9 = 0; lVar9 != lVar1; lVar9 = lVar9 + 1) {
        pfVar11 = (pointer)(lVar9 * 4 +
                           (long)local_38._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl);
        lVar2 = rhs->size_;
        pfVar3 = (rhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl;
        pfVar10 = (float *)((long)(this->data_)._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar8);
        for (lVar6 = 0; lVar1 != lVar6; lVar6 = lVar6 + 1) {
          pfVar11[lVar1 * lVar7] =
               *pfVar10 * *(float *)((long)pfVar3 + lVar6 * 4 + lVar2 * lVar4) +
               pfVar11[lVar1 * lVar7];
          pfVar10 = pfVar10 + lVar1;
        }
        lVar8 = lVar8 + 4;
      }
      lVar4 = lVar4 + 4;
    }
    local_38._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (tuple<float_*,_std::default_delete<float[]>_>)
         (_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)0x0;
    std::__uniq_ptr_impl<float,_std::default_delete<float[]>_>::reset
              ((__uniq_ptr_impl<float,_std::default_delete<float[]>_> *)&this->data_,
               (pointer)__p._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                        super__Head_base<0UL,_float_*,_false>._M_head_impl);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)&local_38);
    return this;
  }
  __assert_fail("size_ == rhs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0xb0,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<float>::operator*=(const SquareMatrix<T> &) [T = float]"
               );
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }